

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply ply_create(char *name,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata,
                void *pdata)

{
  FILE *__stream;
  FILE *fp;
  p_ply ply;
  void *pdata_local;
  long idata_local;
  p_ply_error_cb error_cb_local;
  e_ply_storage_mode storage_mode_local;
  char *name_local;
  
  if ((name != (char *)0x0) && (storage_mode < 4)) {
    idata_local = (long)error_cb;
    if (error_cb == (p_ply_error_cb)0x0) {
      idata_local = (long)ply_error_cb;
    }
    __stream = fopen(name,"wb");
    if (__stream == (FILE *)0x0) {
      (*(code *)idata_local)(0,"Unable to create file");
      name_local = (char *)0x0;
    }
    else {
      name_local = (char *)ply_create_to_file((FILE *)__stream,storage_mode,
                                              (p_ply_error_cb)idata_local,idata,pdata);
      if ((p_ply)name_local == (p_ply)0x0) {
        fclose(__stream);
      }
      else {
        ((p_ply)name_local)->own_fp = 1;
      }
    }
    return (p_ply)name_local;
  }
  __assert_fail("name && storage_mode <= PLY_DEFAULT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x1d2,
                "p_ply ply_create(const char *, e_ply_storage_mode, p_ply_error_cb, long, void *)");
}

Assistant:

p_ply ply_create(const char *name, e_ply_storage_mode storage_mode,
        p_ply_error_cb error_cb, long idata, void *pdata) {
    p_ply ply = NULL;
    FILE *fp = NULL;
    assert(name && storage_mode <= PLY_DEFAULT);
    if (error_cb == NULL) error_cb = ply_error_cb;
    fp = fopen(name, "wb");
    if (!fp) {
        error_cb(ply, "Unable to create file");
        return NULL;
    }
    ply = ply_create_to_file(fp, storage_mode, error_cb, idata, pdata);
    if (ply) ply->own_fp = 1;
    else fclose(fp);
    return ply;
}